

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackgroundCommand.cpp
# Opt level: O0

void __thiscall senjo::GoCommandHandle::Execute(GoCommandHandle *this)

{
  ulong uVar1;
  long lVar2;
  Output *pOVar3;
  Output local_80;
  Output local_78;
  undefined1 local_70 [8];
  string bestmove;
  string local_50 [8];
  string ponder;
  Output local_20;
  GoCommandHandle *local_18;
  GoCommandHandle *this_local;
  
  local_18 = this;
  if ((this->super_BackgroundCommand).engine == (ChessEngine *)0x0) {
    Output::Output(&local_20,InfoPrefix);
    Output::operator<<(&local_20,(char (*) [32])"Engine not set for \'go\' command");
    Output::~Output(&local_20);
  }
  else {
    ChessEngine::ClearStopFlags((this->super_BackgroundCommand).engine);
    std::__cxx11::string::string(local_50);
    ChessEngine::Go((ChessEngine *)local_70,(int)(this->super_BackgroundCommand).engine,this->depth,
                    (ulong)(uint)this->movestogo,this->movetime,this->wtime,this->winc,this->btime,
                    (string *)this->binc);
    uVar1 = std::__cxx11::string::empty();
    if ((uVar1 & 1) != 0) {
      std::__cxx11::string::operator=((string *)local_70,"none");
      std::__cxx11::string::clear();
    }
    lVar2 = std::__cxx11::string::size();
    if (lVar2 == 0) {
      Output::Output(&local_80,NoPrefix);
      pOVar3 = Output::operator<<(&local_80,(char (*) [10])"bestmove ");
      Output::operator<<(pOVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_70);
      Output::~Output(&local_80);
    }
    else {
      Output::Output(&local_78,NoPrefix);
      pOVar3 = Output::operator<<(&local_78,(char (*) [10])"bestmove ");
      pOVar3 = Output::operator<<(pOVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                          *)local_70);
      pOVar3 = Output::operator<<(pOVar3,(char (*) [9])" ponder ");
      Output::operator<<(pOVar3,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )local_50);
      Output::~Output(&local_78);
    }
    std::__cxx11::string::~string((string *)local_70);
    std::__cxx11::string::~string(local_50);
  }
  return;
}

Assistant:

void GoCommandHandle::Execute()
{
  if (!engine) {
    Output() << "Engine not set for 'go' command";
    return;
  }

  engine->ClearStopFlags();

  std::string ponder; // NOTE: shadows this->ponder
  std::string bestmove =
      engine->Go(depth, movestogo, movetime, wtime, winc, btime, binc, &ponder);

  if (bestmove.empty()) {
    bestmove = "none";
    ponder.clear();
  }

  if (ponder.size()) {
    Output(Output::NoPrefix) << "bestmove " << bestmove << " ponder " << ponder;
  }
  else {
    Output(Output::NoPrefix) << "bestmove " << bestmove;
  }
}